

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

LY_ERR cast_string_recursive
                 (lyd_node *node,lyxp_set *set,uint32_t indent,char **str,uint32_t *used,
                 uint32_t *size)

{
  int iVar1;
  long lVar2;
  ly_ctx *plVar3;
  LY_ERR LVar4;
  uint uVar5;
  lyd_node *plVar6;
  size_t sVar7;
  LY_ERR ret___7;
  LY_ERR ret___6;
  ly_out *out;
  undefined4 local_a0;
  LY_ERR ret___5;
  LY_ERR ret___4;
  LY_ERR ret___3;
  LY_ERR ret___2;
  LY_ERR ret___1;
  LY_ERR ret__;
  LY_ERR rc;
  lyd_node_any *any;
  lyd_node *tree;
  lyd_node *plStack_70;
  lyxp_node_type child_type;
  lyd_node *child;
  char *pcStack_60;
  uint16_t nodetype;
  char *value_str;
  char *ptr;
  char *line;
  char *buf;
  uint32_t *size_local;
  uint32_t *used_local;
  char **str_local;
  lyxp_set *plStack_20;
  uint32_t indent_local;
  lyxp_set *set_local;
  lyd_node *node_local;
  
  value_str = (char *)0x0;
  if ((((set->root_type == LYXP_NODE_ROOT_CONFIG) && (node != (lyd_node *)0x0)) &&
      (node->schema != (lysc_node *)0x0)) && ((node->schema->flags & 2) != 0)) {
    return LY_SUCCESS;
  }
  buf = (char *)size;
  size_local = used;
  used_local = (uint32_t *)str;
  str_local._4_4_ = indent;
  plStack_20 = set;
  set_local = (lyxp_set *)node;
  if (node == (lyd_node *)0x0) {
    ret___2 = cast_string_realloc(set->ctx,1,str,used,size);
    if (ret___2 != LY_SUCCESS) {
      return ret___2;
    }
    strcpy((char *)(*(long *)used_local + (ulong)(*size_local - 1)),"\n");
    *size_local = *size_local + 1;
    str_local._4_4_ = str_local._4_4_ + 1;
    plStack_70 = (lyd_node *)0x0;
    tree._4_4_ = 0;
    while (LVar4 = moveto_axis_node_next
                             (&stack0xffffffffffffff90,(lyxp_node_type *)((long)&tree + 4),
                              (lyd_node *)0x0,plStack_20->root_type,LYXP_AXIS_CHILD,plStack_20),
          LVar4 == LY_SUCCESS) {
      LVar4 = cast_string_recursive
                        (plStack_70,plStack_20,str_local._4_4_,(char **)used_local,size_local,
                         (uint32_t *)buf);
      if (LVar4 != LY_SUCCESS) {
        return LVar4;
      }
      ret___3 = LY_SUCCESS;
    }
    ret___4 = cast_string_realloc(plStack_20->ctx,1,(char **)used_local,size_local,(uint32_t *)buf);
    if (ret___4 != LY_SUCCESS) {
      return ret___4;
    }
    strcpy((char *)(*(long *)used_local + (ulong)(*size_local - 1)),"\n");
    *size_local = *size_local + 1;
  }
  else {
    if (node->schema == (lysc_node *)0x0) {
      plVar6 = lyd_child(node);
      if (plVar6 == (lyd_node *)0x0) {
        child._6_2_ = 4;
      }
      else {
        child._6_2_ = 1;
      }
    }
    else {
      child._6_2_ = node->schema->nodetype;
    }
    if (child._6_2_ != 1) {
      if ((child._6_2_ == 4) || (child._6_2_ == 8)) {
        pcStack_60 = lyd_get_value((lyd_node *)set_local);
        plVar3 = plStack_20->ctx;
        uVar5 = str_local._4_4_ << 1;
        sVar7 = strlen(pcStack_60);
        out._4_4_ = cast_string_realloc(plVar3,uVar5 + sVar7 + 1,(char **)used_local,size_local,
                                        (uint32_t *)buf);
        if (out._4_4_ != LY_SUCCESS) {
          return out._4_4_;
        }
        memset((void *)(*(long *)used_local + (ulong)(*size_local - 1)),0x20,
               (ulong)(str_local._4_4_ << 1));
        *size_local = str_local._4_4_ * 2 + *size_local;
        if (*size_local == 1) {
          sprintf((char *)(*(long *)used_local + (ulong)(*size_local - 1)),"%s",pcStack_60);
          sVar7 = strlen(pcStack_60);
          *size_local = *size_local + (int)sVar7;
          return LY_SUCCESS;
        }
        sprintf((char *)(*(long *)used_local + (ulong)(*size_local - 1)),"%s\n",pcStack_60);
        sVar7 = strlen(pcStack_60);
        *size_local = *size_local + (int)sVar7 + 1;
        return LY_SUCCESS;
      }
      if (child._6_2_ != 0x10) {
        if ((child._6_2_ == 0x20) || (child._6_2_ == 0x60)) {
          _ret__ = set_local;
          lVar2._0_1_ = set_local->non_child_axis;
          lVar2._1_1_ = set_local->not_found;
          lVar2._2_6_ = *(undefined6 *)&set_local->field_0x3a;
          if (lVar2 == 0) {
            line = strdup("");
            if (line == (char *)0x0) {
              ly_log(plStack_20->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                     "cast_string_recursive");
              return LY_EMEM;
            }
          }
          else {
            if ((*(int *)&set_local->ctx == 4) &&
               (LVar4 = lyd_parse_data_mem(plStack_20->ctx,*(char **)&set_local->non_child_axis,
                                           LYD_LYB,0x30000,0,(lyd_node **)&any), LVar4 == LY_SUCCESS
               )) {
              free(*(void **)&_ret__->non_child_axis);
              *(lyd_node_any **)&_ret__->non_child_axis = any;
              *(undefined4 *)&_ret__->ctx = 0;
            }
            iVar1 = *(int *)&_ret__->ctx;
            if (iVar1 == 0) {
              LVar4 = ly_out_new_memory(&line,0,(ly_out **)&ret___7);
              if (LVar4 != LY_SUCCESS) {
                return LVar4;
              }
              ret___1 = lyd_print_all(_ret___7,*(lyd_node **)&_ret__->non_child_axis,LYD_XML,0);
              ly_out_free(_ret___7,(_func_void_void_ptr *)0x0,'\0');
              if (ret___1 != LY_SUCCESS) {
                return ret___1;
              }
            }
            else if (iVar1 - 1U < 3) {
              line = strdup(*(char **)&_ret__->non_child_axis);
              if (line == (char *)0x0) {
                ly_log(plStack_20->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                       "cast_string_recursive");
                return LY_EMEM;
              }
            }
            else if (iVar1 == 4) {
              ly_log(plStack_20->ctx,LY_LLERR,LY_EINVAL,"Cannot convert LYB anydata into string.");
              return LY_EINVAL;
            }
          }
          ptr = strtok_r(line,"\n",&value_str);
          do {
            plVar3 = plStack_20->ctx;
            uVar5 = str_local._4_4_ << 1;
            sVar7 = strlen(ptr);
            ret___1 = cast_string_realloc(plVar3,uVar5 + sVar7 + 1,(char **)used_local,size_local,
                                          (uint32_t *)buf);
            if (ret___1 != LY_SUCCESS) {
              free(line);
              return ret___1;
            }
            memset((void *)(*(long *)used_local + (ulong)(*size_local - 1)),0x20,
                   (ulong)(str_local._4_4_ << 1));
            *size_local = str_local._4_4_ * 2 + *size_local;
            strcpy((char *)(*(long *)used_local + (ulong)(*size_local - 1)),ptr);
            sVar7 = strlen(ptr);
            *size_local = *size_local + (int)sVar7;
            strcpy((char *)(*(long *)used_local + (ulong)(*size_local - 1)),"\n");
            *size_local = *size_local + 1;
            ptr = strtok_r((char *)0x0,"\n",&value_str);
          } while (ptr != (char *)0x0);
          free(line);
          return LY_SUCCESS;
        }
        if ((child._6_2_ != 0x100) && (child._6_2_ != 0x400)) {
          ly_log(plStack_20->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",
                 0x259);
          return LY_EINT;
        }
      }
    }
    ret___5 = cast_string_realloc(plStack_20->ctx,1,(char **)used_local,size_local,(uint32_t *)buf);
    if (ret___5 != LY_SUCCESS) {
      return ret___5;
    }
    strcpy((char *)(*(long *)used_local + (ulong)(*size_local - 1)),"\n");
    *size_local = *size_local + 1;
    for (plStack_70 = lyd_child((lyd_node *)set_local); plStack_70 != (lyd_node *)0x0;
        plStack_70 = plStack_70->next) {
      LVar4 = cast_string_recursive
                        (plStack_70,plStack_20,str_local._4_4_ + 1,(char **)used_local,size_local,
                         (uint32_t *)buf);
      if (LVar4 != LY_SUCCESS) {
        return LVar4;
      }
      local_a0 = 0;
    }
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
cast_string_recursive(const struct lyd_node *node, struct lyxp_set *set, uint32_t indent, char **str, uint32_t *used,
        uint32_t *size)
{
    char *buf, *line, *ptr = NULL;
    const char *value_str;
    uint16_t nodetype;
    const struct lyd_node *child;
    enum lyxp_node_type child_type;
    struct lyd_node *tree;
    struct lyd_node_any *any;
    LY_ERR rc;

    if ((set->root_type == LYXP_NODE_ROOT_CONFIG) && node && node->schema && (node->schema->flags & LYS_CONFIG_R)) {
        return LY_SUCCESS;
    }

    if (!node) {
        /* fake container */
        LY_CHECK_RET(cast_string_realloc(set->ctx, 1, str, used, size));
        strcpy(*str + (*used - 1), "\n");
        ++(*used);

        ++indent;

        /* print all the top-level nodes */
        child = NULL;
        child_type = 0;
        while (!moveto_axis_node_next(&child, &child_type, NULL, set->root_type, LYXP_AXIS_CHILD, set)) {
            LY_CHECK_RET(cast_string_recursive(child, set, indent, str, used, size));
        }

        /* end fake container */
        LY_CHECK_RET(cast_string_realloc(set->ctx, 1, str, used, size));
        strcpy(*str + (*used - 1), "\n");
        ++(*used);

        --indent;
    } else {
        if (node->schema) {
            nodetype = node->schema->nodetype;
        } else if (lyd_child(node)) {
            nodetype = LYS_CONTAINER;
        } else {
            nodetype = LYS_LEAF;
        }

        switch (nodetype) {
        case LYS_CONTAINER:
        case LYS_LIST:
        case LYS_RPC:
        case LYS_NOTIF:
            LY_CHECK_RET(cast_string_realloc(set->ctx, 1, str, used, size));
            strcpy(*str + (*used - 1), "\n");
            ++(*used);

            for (child = lyd_child(node); child; child = child->next) {
                LY_CHECK_RET(cast_string_recursive(child, set, indent + 1, str, used, size));
            }

            break;

        case LYS_LEAF:
        case LYS_LEAFLIST:
            value_str = lyd_get_value(node);

            /* print indent */
            LY_CHECK_RET(cast_string_realloc(set->ctx, indent * 2 + strlen(value_str) + 1, str, used, size));
            memset(*str + (*used - 1), ' ', indent * 2);
            *used += indent * 2;

            /* print value */
            if (*used == 1) {
                sprintf(*str + (*used - 1), "%s", value_str);
                *used += strlen(value_str);
            } else {
                sprintf(*str + (*used - 1), "%s\n", value_str);
                *used += strlen(value_str) + 1;
            }

            break;

        case LYS_ANYXML:
        case LYS_ANYDATA:
            any = (struct lyd_node_any *)node;
            if (!(void *)any->value.tree) {
                /* no content */
                buf = strdup("");
                LY_CHECK_ERR_RET(!buf, LOGMEM(set->ctx), LY_EMEM);
            } else {
                struct ly_out *out;

                if (any->value_type == LYD_ANYDATA_LYB) {
                    /* try to parse it into a data tree */
                    if (lyd_parse_data_mem((struct ly_ctx *)set->ctx, any->value.mem, LYD_LYB,
                            LYD_PARSE_ONLY | LYD_PARSE_STRICT, 0, &tree) == LY_SUCCESS) {
                        /* successfully parsed */
                        free(any->value.mem);
                        any->value.tree = tree;
                        any->value_type = LYD_ANYDATA_DATATREE;
                    }
                    /* error is covered by the following switch where LYD_ANYDATA_LYB causes failure */
                }

                switch (any->value_type) {
                case LYD_ANYDATA_STRING:
                case LYD_ANYDATA_XML:
                case LYD_ANYDATA_JSON:
                    buf = strdup(any->value.json);
                    LY_CHECK_ERR_RET(!buf, LOGMEM(set->ctx), LY_EMEM);
                    break;
                case LYD_ANYDATA_DATATREE:
                    LY_CHECK_RET(ly_out_new_memory(&buf, 0, &out));
                    rc = lyd_print_all(out, any->value.tree, LYD_XML, 0);
                    ly_out_free(out, NULL, 0);
                    LY_CHECK_RET(rc);
                    break;
                case LYD_ANYDATA_LYB:
                    LOGERR(set->ctx, LY_EINVAL, "Cannot convert LYB anydata into string.");
                    return LY_EINVAL;
                }
            }

            line = strtok_r(buf, "\n", &ptr);
            do {
                rc = cast_string_realloc(set->ctx, indent * 2 + strlen(line) + 1, str, used, size);
                if (rc != LY_SUCCESS) {
                    free(buf);
                    return rc;
                }
                memset(*str + (*used - 1), ' ', indent * 2);
                *used += indent * 2;

                strcpy(*str + (*used - 1), line);
                *used += strlen(line);

                strcpy(*str + (*used - 1), "\n");
                *used += 1;
            } while ((line = strtok_r(NULL, "\n", &ptr)));

            free(buf);
            break;

        default:
            LOGINT_RET(set->ctx);
        }
    }

    return LY_SUCCESS;
}